

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O0

llb_task_t * llb_task_create(llb_task_delegate_t delegate)

{
  llb_task_delegate_t delegate_00;
  CAPITask *this;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  _func_void_void_ptr_void_ptr_llb_task_interface_t *local_10;
  
  this = (CAPITask *)operator_new(0x30);
  memcpy(&local_30,&stack0x00000008,0x28);
  delegate_00.destroy_context = (_func_void_void_ptr *)uStack_28;
  delegate_00.context = (void *)local_30;
  delegate_00.start = (_func_void_void_ptr_void_ptr_llb_task_interface_t *)local_20;
  delegate_00.provide_value =
       (_func_void_void_ptr_void_ptr_llb_task_interface_t_uintptr_t_llb_data_t_ptr *)uStack_18;
  delegate_00.inputs_available = local_10;
  anon_unknown.dwarf_1d5768::CAPITask::CAPITask(this,delegate_00);
  return (llb_task_t *)this;
}

Assistant:

llb_task_t* llb_task_create(llb_task_delegate_t delegate) {
  return (llb_task_t*) new CAPITask(delegate);
}